

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

Status google::protobuf::json_internal::anon_unknown_5::
       EmitNull<google::protobuf::json_internal::ParseProto2Descriptor>
                 (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto2Descriptor> field
                 ,Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg)

{
  Msg<google::protobuf::json_internal::ParseProto2Descriptor> *this;
  Field<google::protobuf::json_internal::ParseProto2Descriptor> pFVar1;
  Type TVar2;
  Field in_RCX;
  char *in_R8;
  string_view x;
  AlphaNum local_d0;
  AlphaNum local_a0;
  undefined1 local_70 [40];
  char local_48 [16];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  Field local_28;
  Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg_local;
  Field<google::protobuf::json_internal::ParseProto2Descriptor> field_local;
  JsonLexer *lex_local;
  
  local_28 = in_RCX;
  msg_local = msg;
  field_local = field;
  lex_local = lex;
  TVar2 = Proto2Descriptor::FieldType((Field)msg);
  pFVar1 = field_local;
  this = msg_local;
  switch(TVar2) {
  case TYPE_DOUBLE:
    ParseProto2Descriptor::SetDouble((Field)msg_local,(Msg *)local_28,0.0);
    break;
  case TYPE_FLOAT:
    ParseProto2Descriptor::SetFloat((Field)msg_local,(Msg *)local_28,0.0);
    break;
  case TYPE_INT64:
  case TYPE_SFIXED64:
  case MAX_TYPE:
    ParseProto2Descriptor::SetInt64((Field)msg_local,(Msg *)local_28,0);
    break;
  case TYPE_UINT64:
  case TYPE_FIXED64:
    ParseProto2Descriptor::SetUInt64((Field)msg_local,(Msg *)local_28,0);
    break;
  case TYPE_INT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    ParseProto2Descriptor::SetInt32((Field)msg_local,(Msg *)local_28,0);
    break;
  case TYPE_FIXED32:
  case TYPE_UINT32:
    ParseProto2Descriptor::SetUInt32((Field)msg_local,(Msg *)local_28,0);
    break;
  case TYPE_BOOL:
    ParseProto2Descriptor::SetBool((Field)msg_local,(Msg *)local_28,false);
    break;
  case TYPE_STRING:
  case TYPE_BYTES:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"");
    x._M_str = in_R8;
    x._M_len = (size_t)local_38._M_str;
    ParseProto2Descriptor::SetString
              ((ParseProto2Descriptor *)this,local_28,(Msg *)local_38._M_len,x);
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    ParseProto2Descriptor::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::EmitNull<google::protobuf::json_internal::ParseProto2Descriptor>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto2Descriptor::Field,google::protobuf::json_internal::ParseProto2Descriptor::Msg&)::_lambda(auto:1_const&,auto:2_const&)_1_>
              (lex,msg_local,local_28);
    return (Status)(uintptr_t)lex;
  case TYPE_ENUM:
    ParseProto2Descriptor::SetEnum((Field)msg_local,(Msg *)local_28,0);
    break;
  default:
    absl::lts_20240722::AlphaNum::AlphaNum(&local_a0,"unsupported field type: ");
    TVar2 = Proto2Descriptor::FieldType((Field)msg_local);
    absl::lts_20240722::AlphaNum::
    AlphaNum<google::protobuf::internal::FieldDescriptorLite::Type,void>(&local_d0,TVar2);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_70,&local_a0);
    join_0x00000010_0x00000000_ =
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
    JsonLocation::SourceLocation::current();
    JsonLexer::Invalid(lex,pFVar1,local_70._32_8_,local_48._0_8_);
    std::__cxx11::string::~string((string *)local_70);
    return (Status)(uintptr_t)lex;
  }
  absl::lts_20240722::OkStatus();
  return (Status)(uintptr_t)lex;
}

Assistant:

absl::Status EmitNull(JsonLexer& lex, Field<Traits> field, Msg<Traits>& msg) {
  switch (Traits::FieldType(field)) {
    case FieldDescriptor::TYPE_FLOAT:
      Traits::SetFloat(field, msg, 0);
      break;
    case FieldDescriptor::TYPE_DOUBLE:
      Traits::SetDouble(field, msg, 0);
      break;
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_INT64:
      Traits::SetInt64(field, msg, 0);
      break;
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_UINT64:
      Traits::SetUInt64(field, msg, 0);
      break;
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_INT32:
      Traits::SetInt32(field, msg, 0);
      break;
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_UINT32:
      Traits::SetUInt32(field, msg, 0);
      break;
    case FieldDescriptor::TYPE_BOOL:
      Traits::SetBool(field, msg, false);
      break;
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES:
      Traits::SetString(field, msg, "");
      break;
    case FieldDescriptor::TYPE_ENUM:
      Traits::SetEnum(field, msg, 0);
      break;
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return Traits::NewMsg(field, msg,
                            [](const auto&, const auto&) -> absl::Status {
                              return absl::OkStatus();
                            });
    default:
      return lex.Invalid(
          absl::StrCat("unsupported field type: ", Traits::FieldType(field)));
  }
  return absl::OkStatus();
}